

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_elements_output_commitment_init
              (wally_tx_output *output,uchar *asset,size_t asset_len,uchar *value,size_t value_len,
              uchar *nonce,size_t nonce_len,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len,_Bool is_elements)

{
  int iVar1;
  uchar *__dest;
  uchar *local_48;
  uchar *local_40;
  
  if (output == (wally_tx_output *)0x0) {
    return -2;
  }
  if ((asset != (uchar *)0x0) == (asset_len != 0x21)) {
    return -2;
  }
  if ((value != (uchar *)0x0) == (value_len != 9 && value_len != 0x21)) {
    return -2;
  }
  if ((nonce != (uchar *)0x0) == (nonce_len != 0x21)) {
    return -2;
  }
  if ((surjectionproof != (uchar *)0x0) == (surjectionproof_len == 0)) {
    return -2;
  }
  if ((rangeproof != (uchar *)0x0) == (rangeproof_len == 0)) {
    return -2;
  }
  if (asset_len == 0) {
    local_48 = (uchar *)0x0;
  }
  else {
    local_48 = (uchar *)wally_malloc(asset_len);
    if (local_48 == (uchar *)0x0) {
      iVar1 = -3;
      __dest = (uchar *)0x0;
      local_40 = (uchar *)0x0;
      local_48 = (uchar *)0x0;
      goto LAB_00104d69;
    }
    memcpy(local_48,asset,asset_len);
  }
  if (value_len == 0) {
    local_40 = (uchar *)0x0;
  }
  else {
    local_40 = (uchar *)wally_malloc(value_len);
    if (local_40 == (uchar *)0x0) {
      iVar1 = -3;
      __dest = (uchar *)0x0;
      local_40 = (uchar *)0x0;
      goto LAB_00104d69;
    }
    memcpy(local_40,value,value_len);
  }
  if (nonce_len == 0) {
    __dest = (uchar *)0x0;
  }
  else {
    __dest = (uchar *)wally_malloc(nonce_len);
    if (__dest == (uchar *)0x0) {
      iVar1 = -3;
      __dest = (uchar *)0x0;
      goto LAB_00104d69;
    }
    memcpy(__dest,nonce,nonce_len);
  }
  iVar1 = tx_elements_output_proof_init
                    (output,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len);
  if (iVar1 == 0) {
    output->asset = local_48;
    output->asset_len = asset_len;
    output->value = local_40;
    output->value_len = value_len;
    output->nonce = __dest;
    output->nonce_len = nonce_len;
    if (!is_elements) {
      return 0;
    }
    output->features = output->features | 1;
    return 0;
  }
LAB_00104d69:
  clear_and_free(local_48,asset_len);
  clear_and_free(local_40,value_len);
  clear_and_free(__dest,nonce_len);
  return iVar1;
}

Assistant:

static int tx_elements_output_commitment_init(
    struct wally_tx_output *output,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    bool is_elements)
{
#ifdef BUILD_ELEMENTS
    int ret;
    unsigned char *new_asset = NULL, *new_value = NULL, *new_nonce = NULL;
#endif

    if (!output ||
        BYTES_INVALID_N(asset, asset_len, WALLY_TX_ASSET_CT_ASSET_LEN) ||
        ((value != NULL) != (value_len == WALLY_TX_ASSET_CT_VALUE_LEN ||
                             value_len == WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN)) ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_CT_NONCE_LEN) ||
        BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_asset, asset, asset_len) ||
        !clone_bytes(&new_value, value, value_len) ||
        !clone_bytes(&new_nonce, nonce, nonce_len))
        ret = WALLY_ENOMEM;
    else
        ret = tx_elements_output_proof_init(output,
                                            surjectionproof,
                                            surjectionproof_len,
                                            rangeproof,
                                            rangeproof_len);
    if (ret != WALLY_OK) {
        clear_and_free(new_asset, asset_len);
        clear_and_free(new_value, value_len);
        clear_and_free(new_nonce, nonce_len);
        return ret;
    }

    output->asset = new_asset;
    output->asset_len = asset_len;
    output->value = new_value;
    output->value_len = value_len;
    output->nonce = new_nonce;
    output->nonce_len = nonce_len;
#endif /* BUILD_ELEMENTS */

    if (is_elements)
        output->features |= WALLY_TX_IS_ELEMENTS;

    return WALLY_OK;
}